

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.hpp
# Opt level: O2

status * diy::mpi::detail::recv<int>
                   (status *__return_storage_ptr__,DIY_MPI_Comm comm,int source,int tag,
                   vector<int,_std::allocator<int>_> *x)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  status s;
  status local_48;
  
  MPI_Probe(source,tag,comm.data,&local_48);
  iVar3 = status::count<int>(&local_48);
  std::vector<int,_std::allocator<int>_>::resize(x,(long)iVar3);
  piVar1 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar4 = (ulong)((long)piVar2 - (long)piVar1) >> 2 & 0xffffffff;
  if (piVar2 == piVar1) {
    uVar4 = 0;
  }
  MPI_Recv(piVar1,uVar4,&ompi_mpi_int,source,tag,comm.data,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

status recv(DIY_MPI_Comm comm, int source, int tag, std::vector<T>& x)
  {
    auto s = probe(comm, source, tag);
    x.resize(static_cast<size_t>(s.count<T>()));
    return recv(comm, source, tag, address(x), count(x), datatype_of(x));
  }